

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::InternalCopyArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  void *newValue;
  uint32 count;
  undefined1 local_60 [8];
  ArrayElementEnumerator e;
  
  if ((end <= start) || ((srcArray->super_ArrayObject).length < end)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2c8a,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  e._16_8_ = srcArray;
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_60,srcArray,start,end);
  count = 0;
  while( true ) {
    bVar2 = ArrayElementEnumerator::MoveNext<void*>((ArrayElementEnumerator *)local_60);
    if (!bVar2) break;
    uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_60);
    newValue = ArrayElementEnumerator::GetItem<void*>((ArrayElementEnumerator *)local_60);
    DirectSetItemAt<void*>(dstArray,uVar3 + (dstIndex - start),newValue);
    count = count + 1;
  }
  if (end - start != count) {
    InternalFillFromPrototype(dstArray,dstIndex,(JavascriptArray *)e._16_8_,start,end,count);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyArrayElements(JavascriptArray* dstArray, const uint32 dstIndex, JavascriptArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<Var>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, e.GetItem<Var>());
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }